

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O1

void * btreeblk_alloc_sub(void *voidhandle,bid_t *bid)

{
  ulong *puVar1;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  long *plVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (*(int *)((long)voidhandle + 0x58) == 0) {
    pvVar4 = _btreeblk_alloc(voidhandle,bid,-1);
    return pvVar4;
  }
  if (**(bid_t **)((long)voidhandle + 0x60) != 0xffffffffffffffff) {
    iVar2 = filemgr_is_writable(*(filemgr **)((long)voidhandle + 0x38),
                                **(bid_t **)((long)voidhandle + 0x60));
    plVar5 = *(long **)((long)voidhandle + 0x60);
    uVar8 = (ulong)*(ushort *)((long)plVar5 + 0xc);
    if (iVar2 == 0) {
      if (uVar8 != 0) {
        uVar8 = 0;
        do {
          if (*(char *)(plVar5[2] + uVar8) == '\0') {
            filemgr_add_stale_block
                      (*(filemgr **)((long)voidhandle + 0x38),
                       uVar8 * *(uint *)(plVar5 + 1) + (ulong)*voidhandle * *plVar5,
                       (ulong)*(uint *)(plVar5 + 1));
          }
          uVar8 = uVar8 + 1;
          plVar5 = *(long **)((long)voidhandle + 0x60);
        } while (uVar8 < *(ushort *)((long)plVar5 + 0xc));
      }
    }
    else if (uVar8 != 0) {
      uVar3 = 0;
      uVar7 = 0;
      do {
        if (*(char *)(plVar5[2] + uVar7) == '\0') {
          *(undefined1 *)(plVar5[2] + uVar7) = 1;
          puVar1 = *(ulong **)((long)voidhandle + 0x60);
          *bid = uVar3 | *puVar1 | 0x20000000000000;
          pvVar4 = _btreeblk_read(voidhandle,*puVar1,0);
          lVar6 = *(long *)((long)voidhandle + 0x28);
          puVar1 = *(ulong **)((long)voidhandle + 0x60);
          goto LAB_0011bf87;
        }
        uVar7 = uVar7 + 1;
        uVar3 = uVar3 + 0x1000000000000;
      } while (uVar8 != uVar7);
    }
  }
  pvVar4 = _btreeblk_alloc(voidhandle,*(bid_t **)((long)voidhandle + 0x60),0);
  memset(*(void **)(*(long *)((long)voidhandle + 0x60) + 0x10),0,
         (ulong)*(ushort *)(*(long *)((long)voidhandle + 0x60) + 0xc));
  **(undefined1 **)(*(long *)((long)voidhandle + 0x60) + 0x10) = 1;
  *bid = **(ulong **)((long)voidhandle + 0x60) | 0x20000000000000;
  return pvVar4;
LAB_0011bf87:
  if (lVar6 == 0) {
LAB_0011bf9c:
    return (void *)((long)pvVar4 + (ulong)(uint)((int)uVar7 * (int)puVar1[1]));
  }
  if (*(ulong *)(lVar6 + -0x20) ==
      (*puVar1 & 0xffffffffffff) / (ulong)*(ushort *)((long)voidhandle + 4)) {
    *(undefined1 *)(lVar6 + -0x10) = 1;
    goto LAB_0011bf9c;
  }
  lVar6 = *(long *)(lVar6 + 8);
  goto LAB_0011bf87;
}

Assistant:

void * btreeblk_alloc_sub(void *voidhandle, bid_t *bid)
{
    int i;
    void *addr;
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;

    if (handle->nsb == 0) {
        return btreeblk_alloc(voidhandle, bid);
    }

    // check current block is available
    if (handle->sb[0].bid != BLK_NOT_FOUND) {
        if (filemgr_is_writable(handle->file, handle->sb[0].bid)) {
            // check if there is an empty slot
            for (i=0;i<handle->sb[0].nblocks;++i){
                if (handle->sb[0].bitmap[i] == 0) {
                    // return subblock
                    handle->sb[0].bitmap[i] = 1;
                    bid2subbid(handle->sb[0].bid, 0, i, bid);
                    addr = _btreeblk_read(voidhandle, handle->sb[0].bid, 0);
                    btreeblk_set_dirty(voidhandle, handle->sb[0].bid);
                    return (void*)
                           ((uint8_t*)addr +
                            handle->sb[0].sb_size * i);
                }
            }
        } else {
            // we have to mark all unused slots as stale
            size_t idx;
            for (idx=0; idx<handle->sb[0].nblocks; ++idx) {
                if (handle->sb[0].bitmap[idx] == 0) {
                    _btreeblk_add_stale_block(handle,
                        (handle->sb[0].bid * handle->nodesize)
                            + (idx * handle->sb[0].sb_size),
                        handle->sb[0].sb_size);
                }
            }
        }
    }

    // existing subblock cannot be used .. give it up & allocate new one
    addr = _btreeblk_alloc(voidhandle, &handle->sb[0].bid, 0);
    memset(handle->sb[0].bitmap, 0, handle->sb[0].nblocks);
    i = 0;
    handle->sb[0].bitmap[i] = 1;
    bid2subbid(handle->sb[0].bid, 0, i, bid);
    return (void*)((uint8_t*)addr + handle->sb[0].sb_size * i);
}